

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandQbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  uint fDumpCnf;
  char *pcVar6;
  uint local_40;
  uint local_3c;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fDumpCnf = 0;
  Extra_UtilGetoptReset();
  local_40 = 500;
  local_3c = 0xffffffff;
  fVerbose = 0;
LAB_00230189:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"PIdvh"), iVar5 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else if (pAVar3->nObjCounts[8] == 0) {
        if (pAVar3->vPos->nSize == 1) {
          if ((0 < (int)local_3c) && ((int)local_3c < pAVar3->vPis->nSize)) {
            if (pAVar3->ntkType == ABC_NTK_STRASH) {
              Abc_NtkQbf(pAVar3,local_3c,local_40,fDumpCnf,fVerbose);
              return 0;
            }
            pAVar3 = Abc_NtkStrash(pAVar3,0,1,0);
            Abc_NtkQbf(pAVar3,local_3c,local_40,fDumpCnf,fVerbose);
            Abc_NtkDelete(pAVar3);
            return 0;
          }
          pcVar4 = "The number of parameter variables is invalid (should be > 0 and < PI num).\n";
        }
        else {
          pcVar4 = "The miter should have one primary output.\n";
        }
      }
      else {
        pcVar4 = "Works only for combinational networks.\n";
      }
      iVar5 = -1;
      goto LAB_0023036b;
    }
    if (iVar1 == 0x49) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_002302cc:
        Abc_Print(-1,pcVar4);
        goto LAB_002302d6;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_40 = uVar2;
    }
    else {
      if (iVar1 == 100) {
        fDumpCnf = fDumpCnf ^ 1;
        goto LAB_00230189;
      }
      if (iVar1 != 0x50) goto LAB_002302d6;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_002302cc;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_3c = uVar2;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_002302d6:
      iVar5 = -2;
      Abc_Print(-2,"usage: qbf [-PI num] [-dvh]\n");
      Abc_Print(-2,"\t         solves QBF problem EpVxM(p,x)\n");
      Abc_Print(-2,"\t-P num : number of parameters p (should be the first PIs) [default = %d]\n",
                (ulong)local_3c);
      Abc_Print(-2,"\t-I num : quit after the given iteration even if unsolved [default = %d]\n",
                (ulong)local_40);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (fDumpCnf == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n",
                pcVar4);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0023036b:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandQbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nPars;
    int nIters;
    int fDumpCnf;
    int fVerbose;

    extern void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nIters, int fDumpCnf, int fVerbose );
    // set defaults
    nPars    =  -1;
    nIters   = 500;
    fDumpCnf =   0;
    fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PIdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPars < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIters < 0 )
                goto usage;
            break;
        case 'd':
            fDumpCnf ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "Works only for combinational networks.\n" );
        return 1;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "The miter should have one primary output.\n" );
        return 1;
    }
    if ( !(nPars > 0 && nPars < Abc_NtkPiNum(pNtk)) )
    {
        Abc_Print( -1, "The number of parameter variables is invalid (should be > 0 and < PI num).\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_NtkQbf( pNtk, nPars, nIters, fDumpCnf, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 1, 0 );
        Abc_NtkQbf( pNtk, nPars, nIters, fDumpCnf, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: qbf [-PI num] [-dvh]\n" );
    Abc_Print( -2, "\t         solves QBF problem EpVxM(p,x)\n" );
    Abc_Print( -2, "\t-P num : number of parameters p (should be the first PIs) [default = %d]\n", nPars );
    Abc_Print( -2, "\t-I num : quit after the given iteration even if unsolved [default = %d]\n", nIters );
    Abc_Print( -2, "\t-d     : toggle dumping QDIMACS file instead of solving [default = %s]\n", fDumpCnf? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}